

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O0

uint __thiscall apngasm::APNGAsm::read_chunk(APNGAsm *this,FILE *f,CHUNK *pChunk)

{
  size_t sVar1;
  uchar *puVar2;
  uint local_2c;
  CHUNK *pCStack_28;
  uchar len [4];
  CHUNK *pChunk_local;
  FILE *f_local;
  APNGAsm *this_local;
  
  pCStack_28 = pChunk;
  sVar1 = fread(&local_2c,4,1,(FILE *)f);
  if (sVar1 == 1) {
    pCStack_28->size =
         local_2c * 0x1000000 + (local_2c >> 8 & 0xff) * 0x10000 + (local_2c >> 0x10 & 0xff) * 0x100
         + (local_2c >> 0x18) + 0xc;
    puVar2 = (uchar *)operator_new__((ulong)pCStack_28->size);
    pCStack_28->p = puVar2;
    *(uint *)pCStack_28->p = local_2c;
    sVar1 = fread(pCStack_28->p + 4,(ulong)(pCStack_28->size - 4),1,(FILE *)f);
    if (sVar1 == 1) {
      return *(uint *)(pCStack_28->p + 4);
    }
  }
  return 0;
}

Assistant:

unsigned int APNGAsm::read_chunk(FILE * f, CHUNK * pChunk)
  {
    unsigned char len[4];
    if (fread(&len, 4, 1, f) == 1)
    {
      pChunk->size = png_get_uint_32(len) + 12;
      pChunk->p = new unsigned char[pChunk->size];
      memcpy(pChunk->p, len, 4);
      if (fread(pChunk->p + 4, pChunk->size - 4, 1, f) == 1)
        return *(unsigned int *)(pChunk->p + 4);
    }
    return 0;
  }